

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragBehavior(ImGuiID id,ImGuiDataType data_type,void *v,float v_speed,void *v_min,
                        void *v_max,char *format,float power,ImGuiDragFlags flags)

{
  char cVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int v_max_00;
  uint v_max_01;
  longlong v_max_02;
  unsigned_long_long v_max_03;
  int v_min_00;
  uint v_min_01;
  longlong v_min_02;
  unsigned_long_long v_min_03;
  float v_min_04;
  double v_min_05;
  float v_max_04;
  double v_max_05;
  
  pIVar2 = GImGui;
  if (GImGui->ActiveId == id) {
    if (GImGui->ActiveIdSource == ImGuiInputSource_Nav) {
      if (GImGui->NavActivatePressedId != id) goto LAB_00144175;
      cVar1 = GImGui->ActiveIdIsJustActivated;
    }
    else {
      if (GImGui->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_00144175;
      cVar1 = (GImGui->IO).MouseDown[0];
    }
    if (cVar1 == '\0') {
      ClearActiveID();
    }
  }
LAB_00144175:
  if (pIVar2->ActiveId == id) {
    switch(data_type) {
    case 0:
      if (v_min == (void *)0x0) {
        v_min_00 = -0x80000000;
      }
      else {
        v_min_00 = *v_min;
      }
      if (v_max == (void *)0x0) {
        v_max_00 = 0x7fffffff;
      }
      else {
        v_max_00 = *v_max;
      }
      bVar3 = DragBehaviorT<int,int,float>(0,(int *)v,v_speed,v_min_00,v_max_00,format,power,flags);
      return bVar3;
    case 1:
      if (v_min == (void *)0x0) {
        v_min_01 = 0;
      }
      else {
        v_min_01 = *v_min;
      }
      if (v_max == (void *)0x0) {
        v_max_01 = 0xffffffff;
      }
      else {
        v_max_01 = *v_max;
      }
      bVar3 = DragBehaviorT<unsigned_int,int,float>
                        (1,(uint *)v,v_speed,v_min_01,v_max_01,format,power,flags);
      return bVar3;
    case 2:
      v_max_02 = 0x7fffffffffffffff;
      if (v_min == (void *)0x0) {
        v_min_02 = -0x8000000000000000;
      }
      else {
        v_min_02 = *v_min;
      }
      if (v_max != (void *)0x0) {
        v_max_02 = *v_max;
      }
      bVar3 = DragBehaviorT<long_long,long_long,double>
                        (2,(longlong *)v,v_speed,v_min_02,v_max_02,format,power,flags);
      return bVar3;
    case 3:
      if (v_min == (void *)0x0) {
        v_min_03 = 0;
      }
      else {
        v_min_03 = *v_min;
      }
      if (v_max == (void *)0x0) {
        v_max_03 = 0xffffffffffffffff;
      }
      else {
        v_max_03 = *v_max;
      }
      bVar3 = DragBehaviorT<unsigned_long_long,long_long,double>
                        (3,(unsigned_long_long *)v,v_speed,v_min_03,v_max_03,format,power,flags);
      return bVar3;
    case 4:
      if (v_min == (void *)0x0) {
        v_min_04 = -3.4028235e+38;
      }
      else {
        v_min_04 = *v_min;
      }
      if (v_max == (void *)0x0) {
        v_max_04 = 3.4028235e+38;
      }
      else {
        v_max_04 = *v_max;
      }
      bVar3 = DragBehaviorT<float,float,float>
                        (4,(float *)v,v_speed,v_min_04,v_max_04,format,power,flags);
      return bVar3;
    case 5:
      if (v_min == (void *)0x0) {
        v_min_05 = -1.79769313486232e+308;
      }
      else {
        v_min_05 = *v_min;
      }
      if (v_max == (void *)0x0) {
        v_max_05 = 1.79769313486232e+308;
      }
      else {
        v_max_05 = *v_max;
      }
      bVar3 = DragBehaviorT<double,double,double>
                        (5,(double *)v,v_speed,v_min_05,v_max_05,format,power,flags);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool ImGui::DragBehavior(ImGuiID id, ImGuiDataType data_type, void* v, float v_speed, const void* v_min, const void* v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse && !g.IO.MouseDown[0])
            ClearActiveID();
        else if (g.ActiveIdSource == ImGuiInputSource_Nav && g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            ClearActiveID();
    }
    if (g.ActiveId != id)
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S32:    return DragBehaviorT<ImS32, ImS32, float >(data_type, (ImS32*)v,  v_speed, v_min ? *(const ImS32* )v_min : IM_S32_MIN, v_max ? *(const ImS32* )v_max : IM_S32_MAX, format, power, flags);
    case ImGuiDataType_U32:    return DragBehaviorT<ImU32, ImS32, float >(data_type, (ImU32*)v,  v_speed, v_min ? *(const ImU32* )v_min : IM_U32_MIN, v_max ? *(const ImU32* )v_max : IM_U32_MAX, format, power, flags);
    case ImGuiDataType_S64:    return DragBehaviorT<ImS64, ImS64, double>(data_type, (ImS64*)v,  v_speed, v_min ? *(const ImS64* )v_min : IM_S64_MIN, v_max ? *(const ImS64* )v_max : IM_S64_MAX, format, power, flags);
    case ImGuiDataType_U64:    return DragBehaviorT<ImU64, ImS64, double>(data_type, (ImU64*)v,  v_speed, v_min ? *(const ImU64* )v_min : IM_U64_MIN, v_max ? *(const ImU64* )v_max : IM_U64_MAX, format, power, flags);
    case ImGuiDataType_Float:  return DragBehaviorT<float, float, float >(data_type, (float*)v,  v_speed, v_min ? *(const float* )v_min : -FLT_MAX,   v_max ? *(const float* )v_max : FLT_MAX,    format, power, flags);
    case ImGuiDataType_Double: return DragBehaviorT<double,double,double>(data_type, (double*)v, v_speed, v_min ? *(const double*)v_min : -DBL_MAX,   v_max ? *(const double*)v_max : DBL_MAX,    format, power, flags);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}